

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_action.cpp
# Opt level: O0

void __thiscall
cppnet::EpollEventActions::OnEvent
          (EpollEventActions *this,vector<epoll_event,_std::allocator<epoll_event>_> *event_vec,
          int16_t num)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Event *this_01;
  bool bVar1;
  uint16_t uVar2;
  reference pvVar3;
  SingletonLogger *pSVar4;
  ssize_t sVar5;
  element_type *peVar6;
  element_type *peVar7;
  undefined1 local_e0 [8];
  shared_ptr<cppnet::RWSocket> rw_sock;
  shared_ptr<cppnet::ConnectSocket> connect_sock;
  LogStreamParam local_b0;
  LogStream local_80;
  undefined1 local_50 [8];
  char buf [4];
  uint local_3c;
  int i;
  Event *event;
  shared_ptr<cppnet::Socket> sock;
  int16_t num_local;
  vector<epoll_event,_std::allocator<epoll_event>_> *event_vec_local;
  EpollEventActions *this_local;
  
  sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ = num;
  std::shared_ptr<cppnet::Socket>::shared_ptr((shared_ptr<cppnet::Socket> *)&event);
  for (local_3c = 0;
      (int)local_3c <
      (int)sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
           _6_2_; local_3c = local_3c + 1) {
    pvVar3 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                       (event_vec,(long)(int)local_3c);
    if ((pvVar3->data).fd == this->_pipe[0]) {
      pSVar4 = Singleton<cppnet::SingletonLogger>::Instance();
      SingletonLogger::Warn
                (pSVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                 ,0x132,"weak up the IO thread, index : %d",(ulong)local_3c);
      sVar5 = read(this->_pipe[0],local_50,1);
      if (sVar5 < 1) {
        pSVar4 = Singleton<cppnet::SingletonLogger>::Instance();
        SingletonLogger::GetStreamParam
                  (&local_b0,pSVar4,LL_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                   ,0x139);
        LogStream::LogStream(&local_80,&local_b0);
        LogStream::operator<<(&local_80,"read from pipe failed when weak up.");
        LogStream::~LogStream(&local_80);
        std::pair<std::shared_ptr<cppnet::Log>,_std::function<void_(std::shared_ptr<cppnet::Log>)>_>
        ::~pair(&local_b0);
      }
    }
    else {
      pvVar3 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                         (event_vec,(long)(int)local_3c);
      this_01 = (Event *)(pvVar3->data).ptr;
      Event::GetSocket((Event *)&connect_sock.
                                 super___shared_ptr<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      std::shared_ptr<cppnet::Socket>::operator=
                ((shared_ptr<cppnet::Socket> *)&event,
                 (shared_ptr<cppnet::Socket> *)
                 &connect_sock.super___shared_ptr<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::shared_ptr<cppnet::Socket>::~shared_ptr
                ((shared_ptr<cppnet::Socket> *)
                 &connect_sock.super___shared_ptr<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&event);
      if (bVar1) {
        uVar2 = Event::GetType(this_01);
        if ((uVar2 & 4) == 0) {
          std::dynamic_pointer_cast<cppnet::RWSocket,cppnet::Socket>
                    ((shared_ptr<cppnet::Socket> *)local_e0);
          pvVar3 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                             (event_vec,(long)(int)local_3c);
          if ((pvVar3->events & 1) != 0) {
            pvVar3 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                               (event_vec,(long)(int)local_3c);
            if ((pvVar3->events & 0x2000) == 0) {
              peVar7 = std::
                       __shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_e0);
              (*(peVar7->super_Socket)._vptr_Socket[0xe])(peVar7,0);
            }
            else {
              peVar7 = std::
                       __shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_e0);
              (*(peVar7->super_Socket)._vptr_Socket[0x11])(peVar7,1);
            }
          }
          pvVar3 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                             (event_vec,(long)(int)local_3c);
          if ((pvVar3->events & 4) != 0) {
            peVar7 = std::
                     __shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_e0);
            (*(peVar7->super_Socket)._vptr_Socket[0xf])(peVar7,0);
          }
          pvVar3 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                             (event_vec,(long)(int)local_3c);
          if ((pvVar3->events & 0x10) != 0) {
            peVar7 = std::
                     __shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_e0);
            (*(peVar7->super_Socket)._vptr_Socket[0x11])(peVar7,1);
          }
          std::shared_ptr<cppnet::RWSocket>::~shared_ptr((shared_ptr<cppnet::RWSocket> *)local_e0);
        }
        else {
          this_00 = &rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
          std::dynamic_pointer_cast<cppnet::ConnectSocket,cppnet::Socket>
                    ((shared_ptr<cppnet::Socket> *)this_00);
          peVar6 = std::
                   __shared_ptr_access<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this_00);
          (*(peVar6->super_Socket)._vptr_Socket[6])();
          std::shared_ptr<cppnet::ConnectSocket>::~shared_ptr
                    ((shared_ptr<cppnet::ConnectSocket> *)
                     &rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
      else {
        pSVar4 = Singleton<cppnet::SingletonLogger>::Instance();
        SingletonLogger::Warn
                  (pSVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                   ,0x141,"EPOLL weak up but socket already destroy, index : %d",(ulong)local_3c);
      }
    }
  }
  std::shared_ptr<cppnet::Socket>::~shared_ptr((shared_ptr<cppnet::Socket> *)&event);
  return;
}

Assistant:

void EpollEventActions::OnEvent(std::vector<epoll_event>& event_vec, int16_t num) {
    std::shared_ptr<Socket> sock;
    Event* event = nullptr;

    for (int i = 0; i < num; i++) {
        if ((uint32_t)event_vec[i].data.fd == _pipe[0]) {
            LOG_WARN("weak up the IO thread, index : %d", i);
            char buf[4];
#ifdef __win__
            if (recv(_pipe[0], buf, 1, 0) <= 0) {
#else
            if (read(_pipe[0], buf, 1) <= 0) {
#endif
                LOG_ERROR_S << "read from pipe failed when weak up.";
            }
            continue;
        }

        event = (Event*)event_vec[i].data.ptr;
        sock = event->GetSocket();
        if (!sock) {
            LOG_WARN("EPOLL weak up but socket already destroy, index : %d", i);
            continue;
        }

        // accept event
        if (event->GetType() & ET_ACCEPT) {
            std::shared_ptr<ConnectSocket> connect_sock = std::dynamic_pointer_cast<ConnectSocket>(sock);
            connect_sock->OnAccept();

        } else {
            std::shared_ptr<RWSocket> rw_sock = std::dynamic_pointer_cast<RWSocket>(sock);
            if (event_vec[i].events & EPOLLIN) {
                // close
                if (event_vec[i].events & EPOLLRDHUP) {
                    rw_sock->OnDisConnect(CEC_CLOSED);
                    
                } else {
                    rw_sock->OnRead();
                }
            }

            if (event_vec[i].events & EPOLLOUT) {
                rw_sock->OnWrite();
            }

            if (event_vec[i].events & EPOLLHUP) {
                rw_sock->OnDisConnect(CEC_CLOSED);
            }
        }
    }
}

bool EpollEventActions::AddEvent(epoll_event* ev, int32_t event_flag, uint64_t sock, bool in_actions) {
    //if not add to EPOLL
    if (!(ev->events & event_flag)) {
#ifdef __win__
        ev->events |= event_flag;
#else
        if (__epoll_use_et) {
            ev->events |= event_flag | EPOLLET;

        } else {
             ev->events |= event_flag;
        }
#if LINUX_VERSION_CODE >= KERNEL_VERSION(4,5,0)
        if (__epoll_exclusive) {
            ev->events |= EPOLLEXCLUSIVE;
        }
#endif
#endif

        int32_t ret = 0;
        if (in_actions) {
            ret = epoll_ctl(_epoll_handler, EPOLL_CTL_MOD, sock, ev);

        } else {
            ret = epoll_ctl(_epoll_handler, EPOLL_CTL_ADD, sock, ev);
        }
            
        if (ret == 0) {
            return true;
        }
        LOG_ERROR("modify event to EPOLL failed! error :%d, sock: %d", errno, sock);
    }
    return false;
}

bool EpollEventActions::MakeEpollEvent(Event* event, epoll_event* &ep_event) {
    auto sock = event->GetSocket();
    if (!sock) {
        LOG_WARN("socket is already destroyed! event %s", "AddSendEvent");
        return false;
    }

    auto rw_sock = std::dynamic_pointer_cast<RWSocket>(sock);
    ep_event = rw_sock->GetAlloter()->PoolNew<epoll_event>();
    memset(ep_event, 0, sizeof(epoll_event));
    event->SetData(ep_event);
    ep_event->data.ptr = (void*)event;

    return true;
}

#ifdef __win__
bool EpollEventActions::Pipe(SOCKET fd[2]) {
        SOCKET listener = socket(AF_INET, SOCK_STREAM, 0);
    if (listener < 0)
        return false;

    struct sockaddr_in listen_addr;
    memset(&listen_addr, 0, sizeof(listen_addr));
    listen_addr.sin_family = AF_INET;
    listen_addr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
    listen_addr.sin_port = 0;	/* kernel chooses port.	 */
    if (bind(listener, (struct sockaddr *) &listen_addr, sizeof(listen_addr)) == -1) {
        return false;
    }
    if (listen(listener, 1) == -1) {
        return false;
    }
    SOCKET connector = socket(AF_INET, SOCK_STREAM, 0);
    if (connector < 0) {
        return false;
    }

    /* We want to find out the port number to connect to.  */
    struct sockaddr_in connect_addr;
    int size = sizeof(connect_addr);
    if (getsockname(listener, (struct sockaddr *) &connect_addr, &size) == -1) {
        return false;
    }
        
    if (size != sizeof(connect_addr)) {
        return false;
    }

    if (connect(connector, (struct sockaddr *) &connect_addr, sizeof(connect_addr)) == -1) {
        return false;
    }

    size = sizeof(listen_addr);
    SOCKET acceptor = accept(listener, (struct sockaddr *) &listen_addr, &size);
    if (acceptor < 0) {
        return false;
    }
    if (size != sizeof(listen_addr)) {
        return false;
    }

    // check options
    if (getsockname(connector, (struct sockaddr *) &connect_addr, &size) == -1) {
        return false;
    }
    if (size != sizeof(connect_addr)
        || listen_addr.sin_family != connect_addr.sin_family
        || listen_addr.sin_addr.s_addr != connect_addr.sin_addr.s_addr
        || listen_addr.sin_port != connect_addr.sin_port) {
        return false;
    }
    closesocket(listener);

    fd[0] = connector;
    fd[1] = acceptor;
    return true;
}
#endif

}